

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[26],std::__cxx11::string,char[14],std::__cxx11::string,char[24],std::__cxx11::string,char[24]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [26],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [24],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [24])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  size_t local_b0;
  char *pcStack_a8;
  size_t local_a0;
  char (*local_98) [26];
  size_type local_90;
  pointer local_88;
  size_t local_80;
  char (*local_78) [14];
  size_type local_70;
  pointer local_68;
  size_t local_60;
  char (*local_58) [24];
  size_type local_50;
  pointer local_48;
  size_t local_40;
  char (*local_38) [24];
  
  local_c0._M_len = (a->View_)._M_len;
  local_c0._M_str = (a->View_)._M_str;
  local_b0 = (b->View_)._M_len;
  pcStack_a8 = (b->View_)._M_str;
  local_a0 = strlen(*args);
  local_88 = (args_1->_M_dataplus)._M_p;
  local_90 = args_1->_M_string_length;
  local_98 = args;
  local_80 = strlen(*args_2);
  local_68 = (args_3->_M_dataplus)._M_p;
  local_70 = args_3->_M_string_length;
  local_78 = args_2;
  local_60 = strlen(*args_4);
  local_58 = args_4;
  local_48 = (args_5->_M_dataplus)._M_p;
  local_50 = args_5->_M_string_length;
  local_40 = strlen(*args_6);
  local_38 = args_6;
  views._M_len = 9;
  views._M_array = &local_c0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}